

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

void CheckType(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Dict *pDVar1;
  Bool BVar2;
  uint code;
  ctmbstr *list;
  
  if (node == (Node *)0x0) {
    return;
  }
  pDVar1 = node->tag;
  if (pDVar1 == (Dict *)0x0) {
    return;
  }
  if (pDVar1->id == TidyTag_INPUT) {
    list = (ctmbstr *)&DAT_001c81c0;
LAB_0013e75f:
    CheckAttrValidity(doc,node,attval,list);
    return;
  }
  if (pDVar1 == (Dict *)0x0) {
    return;
  }
  if (pDVar1->id == TidyTag_BUTTON) {
    list = (ctmbstr *)&DAT_001c8280;
    goto LAB_0013e75f;
  }
  if (pDVar1 == (Dict *)0x0) {
    return;
  }
  if (pDVar1->id == TidyTag_UL) {
    list = (ctmbstr *)&DAT_001c82a0;
    goto LAB_0013e75f;
  }
  if (pDVar1 == (Dict *)0x0) {
    return;
  }
  if (pDVar1->id == TidyTag_OL) {
    if ((attval == (AttVal *)0x0) || (attval->value == (tmbstr)0x0)) {
LAB_0013e7ed:
      code = 0x256;
      goto LAB_0013e7fb;
    }
  }
  else {
    if (pDVar1 == (Dict *)0x0) {
      return;
    }
    if (pDVar1->id != TidyTag_LI) {
      return;
    }
    if ((attval == (AttVal *)0x0) || (attval->value == (tmbstr)0x0)) goto LAB_0013e7ed;
    BVar2 = AttrValueIsAmong(attval,(ctmbstr *)&DAT_001c82a0);
    if (BVar2 != no) {
      CheckLowerCaseAttrValue(doc,node,attval);
      return;
    }
  }
  BVar2 = AttrValueIsAmong(attval,(ctmbstr *)&DAT_001c82c0);
  if (BVar2 != no) {
    return;
  }
  code = 0x22b;
LAB_0013e7fb:
  prvTidyReportAttrError(doc,node,attval,code);
  return;
}

Assistant:

void CheckType( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    ctmbstr const valuesINPUT[] = {
        "text", "password", "checkbox", "radio", "submit", "reset", "file",
        "hidden", "image", "button", "color", "date", "datetime",
        "datetime-local", "email", "month", "number", "range", "search",
        "tel", "time", "url", "week", NULL};
    ctmbstr const valuesBUTTON[] = {"button", "submit", "reset", NULL};
    ctmbstr const valuesUL[] = {"disc", "square", "circle", NULL};
    ctmbstr const valuesOL[] = {"1", "a", "i", NULL};

    if (nodeIsINPUT(node))
        CheckAttrValidity( doc, node, attval, valuesINPUT );
    else if (nodeIsBUTTON(node))
        CheckAttrValidity( doc, node, attval, valuesBUTTON );
    else if (nodeIsUL(node))
        CheckAttrValidity( doc, node, attval, valuesUL );
    else if (nodeIsOL(node))
    {
        if (!AttrHasValue(attval))
        {
            TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
            return;
        }
        if (!AttrValueIsAmong(attval, valuesOL))
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }
    else if (nodeIsLI(node))
    {
        if (!AttrHasValue(attval))
        {
            TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
            return;
        }
        if (AttrValueIsAmong(attval, valuesUL))
            CheckLowerCaseAttrValue( doc, node, attval );
        else if (!AttrValueIsAmong(attval, valuesOL))
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }
    return;
}